

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O0

bool upb_test_TestMapField_map_field_set
               (upb_test_TestMapField *msg,int32_t key,int32_t val,upb_Arena *a)

{
  upb_MapInsertStatus uVar1;
  upb_Map *map_00;
  upb_Map *map;
  upb_MiniTableField field;
  upb_Arena *a_local;
  int32_t val_local;
  int32_t key_local;
  upb_test_TestMapField *msg_local;
  
  stack0xffffffffffffffd4 = 0x800000001;
  field.number_dont_copy_me__upb_internal_use_only = 0xc00b0000;
  field._4_8_ = a;
  a_local._0_4_ = val;
  a_local._4_4_ = key;
  _val_local = msg;
  _upb_MiniTable_StrongReference_dont_copy_me__upb_internal_use_only
            (&upb_0test__TestMapField__MapFieldEntry_msg_init);
  map_00 = _upb_Message_GetOrCreateMutableMap
                     (&_val_local->base_dont_copy_me__upb_internal_use_only,
                      (upb_MiniTableField *)((long)&map + 4),4,4,(upb_Arena *)field._4_8_);
  uVar1 = _upb_Map_Insert(map_00,(void *)((long)&a_local + 4),4,&a_local,4,(upb_Arena *)field._4_8_)
  ;
  return uVar1 != kUpb_MapInsertStatus_OutOfMemory;
}

Assistant:

UPB_INLINE bool upb_test_TestMapField_map_field_set(upb_test_TestMapField* msg, int32_t key, int32_t val, upb_Arena* a) {
  const upb_MiniTableField field = {1, 8, 0, 0, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&upb_0test__TestMapField__MapFieldEntry_msg_init);
  upb_Map* map = _upb_Message_GetOrCreateMutableMap(UPB_UPCAST(msg),
                                                    &field, sizeof(key), sizeof(val), a);
  return _upb_Map_Insert(map, &key, sizeof(key), &val, sizeof(val), a) !=
         kUpb_MapInsertStatus_OutOfMemory;
}